

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EQGameScanner.h
# Opt level: O0

unsigned_long __thiscall
EQGameScanner::findEQStructureOffset<unsigned_long>
          (EQGameScanner *this,DWORD startAddress,size_t blockSize,PBYTE byteMask,PCHAR charMask,
          DWORD baseEQPointerAddress)

{
  DWORD __s;
  PCHAR __src;
  size_t sVar1;
  PDWORD pDVar2;
  long lVar3;
  unsigned_long uVar4;
  unsigned_long nRet;
  allocator<char> local_69;
  string local_68 [32];
  undefined8 *local_48;
  PDWORD valueToChange;
  PBYTE newByteMask;
  DWORD baseEQPointerAddress_local;
  PCHAR charMask_local;
  PBYTE byteMask_local;
  size_t blockSize_local;
  DWORD startAddress_local;
  EQGameScanner *this_local;
  
  newByteMask = (PBYTE)baseEQPointerAddress;
  baseEQPointerAddress_local = (DWORD)charMask;
  charMask_local = (PCHAR)byteMask;
  byteMask_local = (PBYTE)blockSize;
  blockSize_local = startAddress;
  startAddress_local = (DWORD)this;
  sVar1 = strlen(charMask);
  pDVar2 = (PDWORD)operator_new__(sVar1);
  __src = charMask_local;
  valueToChange = pDVar2;
  sVar1 = strlen((char *)baseEQPointerAddress_local);
  memcpy(pDVar2,__src,sVar1);
  __s = baseEQPointerAddress_local;
  pDVar2 = valueToChange;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,(char *)__s,&local_69);
  lVar3 = std::__cxx11::string::find_first_of((char *)local_68,0x107426);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  *(undefined8 *)((long)pDVar2 + lVar3) = newByteMask;
  local_48 = (undefined8 *)((long)pDVar2 + lVar3);
  uVar4 = findEQPointerOffset<unsigned_long>
                    (this,blockSize_local,(size_t)byteMask_local,(PBYTE)valueToChange,
                     (PCHAR)baseEQPointerAddress_local);
  if (valueToChange != (PDWORD)0x0) {
    operator_delete__(valueToChange);
  }
  return uVar4;
}

Assistant:

T findEQStructureOffset(DWORD startAddress, std::size_t blockSize, const PBYTE byteMask, const PCHAR charMask, const DWORD baseEQPointerAddress)
    {
        // Create a new, editable, copy of byteMask.
        PBYTE newByteMask = new BYTE[strlen(charMask)];
        memcpy(newByteMask, byteMask, strlen(charMask));

        // Replace the EQPointer in our byteMask with the EQPointer given as an argument.
        // The location of the EQPointer is denoted by the letter o in our character mask.
        // Currently we require and always assume that the EQPointer is 4 bytes.
        PDWORD valueToChange = reinterpret_cast<PDWORD>(newByteMask + std::string(reinterpret_cast<const PCHAR>(charMask)).find_first_of("o"));
        *valueToChange = baseEQPointerAddress;

        // Use the updated byteMask to locate the EQStructureOffset
        T nRet = findEQPointerOffset<T>(startAddress, blockSize, newByteMask, charMask);
        delete[] newByteMask;

        return nRet;
    }